

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileImporter::CreateDataFromImport(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  undefined4 uVar1;
  Object *pOVar2;
  pointer paVar3;
  pointer paVar4;
  aiMesh *paVar5;
  _Head_base<0UL,_aiMesh_*,_false> _Var6;
  aiNode *this_00;
  aiNode **ppaVar7;
  pointer ppOVar8;
  aiMesh **ppaVar9;
  aiMesh *paVar10;
  aiVector3D *paVar11;
  aiColor4D *paVar12;
  uint *puVar13;
  runtime_error *prVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_78;
  aiMesh *local_58;
  _Head_base<0UL,_aiMesh_*,_false> local_50;
  pointer local_48;
  ulong local_40;
  aiVector3D **local_38;
  
  if (pModel != (Model *)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar20 = (pModel->m_ModelName)._M_string_length;
    if (uVar20 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0xaf,
                    "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                   );
    }
    if (uVar20 < 0x400) {
      (this_00->mName).length = (ai_uint32)uVar20;
      memcpy((this_00->mName).data,(pModel->m_ModelName)._M_dataplus._M_p,uVar20);
      (this_00->mName).data[uVar20] = '\0';
    }
    ppOVar8 = (pModel->m_Objects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)(pModel->m_Objects).
                   super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar8;
    if (lVar15 == 0) {
      paVar3 = (pModel->m_Vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar4 = (pModel->m_Vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar3 != paVar4) {
        paVar10 = (aiMesh *)operator_new(0x520);
        paVar10->mPrimitiveTypes = 0;
        paVar10->mNumVertices = 0;
        paVar10->mNumFaces = 0;
        local_38 = &paVar10->mVertices;
        memset(local_38,0,0xcc);
        paVar10->mBones = (aiBone **)0x0;
        paVar10->mMaterialIndex = 0;
        (paVar10->mName).length = 0;
        (paVar10->mName).data[0] = '\0';
        memset((paVar10->mName).data + 1,0x1b,0x3ff);
        paVar10->mNumAnimMeshes = 0;
        paVar10->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar10->mMethod = 0;
        (paVar10->mAABB).mMin.x = 0.0;
        (paVar10->mAABB).mMin.y = 0.0;
        (paVar10->mAABB).mMin.z = 0.0;
        (paVar10->mAABB).mMax.x = 0.0;
        (paVar10->mAABB).mMax.y = 0.0;
        (paVar10->mAABB).mMax.z = 0.0;
        paVar10->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar10->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar10->mNumUVComponents[0] = 0;
        paVar10->mNumUVComponents[1] = 0;
        paVar10->mNumUVComponents[2] = 0;
        paVar10->mNumUVComponents[3] = 0;
        paVar10->mNumUVComponents[4] = 0;
        paVar10->mNumUVComponents[5] = 0;
        paVar10->mNumUVComponents[6] = 0;
        paVar10->mNumUVComponents[7] = 0;
        paVar10->mColors[0] = (aiColor4D *)0x0;
        paVar10->mColors[1] = (aiColor4D *)0x0;
        paVar10->mColors[2] = (aiColor4D *)0x0;
        paVar10->mColors[3] = (aiColor4D *)0x0;
        paVar10->mColors[4] = (aiColor4D *)0x0;
        paVar10->mColors[5] = (aiColor4D *)0x0;
        paVar10->mColors[6] = (aiColor4D *)0x0;
        paVar10->mColors[7] = (aiColor4D *)0x0;
        paVar10->mPrimitiveTypes = 1;
        lVar16 = (long)paVar4 - (long)paVar3;
        lVar15 = lVar16 >> 0x3f;
        uVar20 = (lVar16 / 6 + lVar15 >> 1) - lVar15;
        uVar17 = (uint)uVar20;
        paVar10->mNumVertices = uVar17;
        uVar20 = uVar20 & 0xffffffff;
        local_58 = (aiMesh *)(uVar20 * 0xc);
        local_50._M_head_impl = paVar10;
        local_48 = paVar3;
        paVar11 = (aiVector3D *)operator_new__((ulong)local_58);
        if (uVar20 != 0) {
          memset(paVar11,0,((uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar5 = local_58;
        *local_38 = paVar11;
        local_40 = uVar20;
        memcpy(paVar11,local_48,(size_t)local_58);
        local_48 = (pModel->m_Normals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        paVar3 = (pModel->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_48 != paVar3) {
          paVar11 = (aiVector3D *)operator_new__((ulong)paVar5);
          if (local_40 != 0) {
            memset(paVar11,0,((local_40 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar10->mNormals = paVar11;
          if ((ulong)(((long)paVar3 - (long)local_48 >> 2) * -0x5555555555555555) < local_40) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"OBJ: vertex normal index out of range","");
            std::runtime_error::runtime_error(prVar14,(string *)&local_78);
            *(undefined ***)prVar14 = &PTR__runtime_error_007fd498;
            __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy(paVar11,local_48,(size_t)local_58);
        }
        if ((pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_58 = local_50._M_head_impl;
          uVar19 = (local_50._M_head_impl)->mNumVertices;
          uVar20 = (ulong)uVar19 << 4;
          paVar12 = (aiColor4D *)operator_new__(uVar20);
          if ((ulong)uVar19 != 0) {
            memset(paVar12,0,uVar20);
          }
          local_58->mColors[0] = paVar12;
          if (uVar17 != 0) {
            lVar15 = 8;
            lVar16 = 0xc;
            uVar20 = 0;
            do {
              paVar3 = (pModel->m_VertexColors).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar18 = ((long)(pModel->m_VertexColors).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
                       -0x5555555555555555;
              if (uVar18 < uVar20 || uVar18 - uVar20 == 0) {
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,"OBJ: vertex color index out of range","");
                std::runtime_error::runtime_error(prVar14,(string *)&local_78);
                *(undefined ***)prVar14 = &PTR__runtime_error_007fd498;
                __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              uVar1 = *(undefined4 *)((long)&paVar3->x + lVar15);
              paVar12 = (local_50._M_head_impl)->mColors[0];
              *(undefined8 *)((long)paVar12 + lVar16 + -0xc) =
                   *(undefined8 *)((long)paVar3 + lVar15 + -8);
              *(undefined4 *)((long)paVar12 + lVar16 + -4) = uVar1;
              *(undefined4 *)((long)&paVar12->r + lVar16) = 0x3f800000;
              uVar20 = uVar20 + 1;
              lVar15 = lVar15 + 0xc;
              lVar16 = lVar16 + 0x10;
            } while (uVar17 != (uint)uVar20);
          }
        }
        pScene->mRootNode->mNumMeshes = 1;
        puVar13 = (uint *)operator_new__(4);
        pScene->mRootNode->mMeshes = puVar13;
        *pScene->mRootNode->mMeshes = 0;
        ppaVar9 = (aiMesh **)operator_new__(8);
        _Var6._M_head_impl = local_50._M_head_impl;
        pScene->mMeshes = ppaVar9;
        pScene->mNumMeshes = 1;
        local_50._M_head_impl = (aiMesh *)0x0;
        *ppaVar9 = _Var6._M_head_impl;
        std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                  ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_50);
      }
    }
    else {
      lVar15 = lVar15 >> 3;
      lVar16 = 0;
      uVar17 = 0;
      uVar19 = 0;
      do {
        pOVar2 = ppOVar8[lVar16];
        if (pOVar2 != (Object *)0x0) {
          uVar17 = uVar17 + 1;
          uVar19 = uVar19 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&(pOVar2->m_Meshes).
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(pOVar2->m_Meshes).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2);
        }
        lVar16 = lVar16 + 1;
      } while (lVar15 + (ulong)(lVar15 == 0) != lVar16);
      ppaVar7 = (aiNode **)operator_new__((ulong)uVar17 << 3);
      this_00->mChildren = ppaVar7;
      local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_78,(ulong)uVar19);
      ppOVar8 = (pModel->m_Objects).
                super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pModel->m_Objects).
          super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppOVar8) {
        uVar20 = 0;
        do {
          createNodes(this,pModel,ppOVar8[uVar20],pScene->mRootNode,pScene,&local_78);
          uVar20 = uVar20 + 1;
          ppOVar8 = (pModel->m_Objects).
                    super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar20 < (ulong)((long)(pModel->m_Objects).
                                        super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar8
                                 >> 3));
      }
      if (pScene->mRootNode->mNumChildren != uVar17) {
        __assert_fail("pScene->mRootNode->mNumChildren == childCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                      ,200,
                      "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                     );
      }
      if (pScene->mNumMeshes != 0) {
        uVar20 = 0xffffffffffffffff;
        if (-1 < (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          uVar20 = (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        ppaVar9 = (aiMesh **)operator_new__(uVar20);
        pScene->mMeshes = ppaVar9;
        if (local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar20 = 0;
          do {
            pScene->mMeshes[uVar20] =
                 local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar20 < (ulong)((long)local_78.
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      createMaterials(this,pModel,pScene);
      if (local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void ObjFileImporter::CreateDataFromImport(const ObjFile::Model* pModel, aiScene* pScene) {
    if( 0L == pModel ) {
        return;
    }

    // Create the root node of the scene
    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        // Set the name of the scene
        pScene->mRootNode->mName.Set(pModel->m_ModelName);
    } else {
        // This is a fatal error, so break down the application
        ai_assert(false);
    }

    if (pModel->m_Objects.size() > 0) {

        unsigned int meshCount = 0;
        unsigned int childCount = 0;

        for(size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            if(pModel->m_Objects[index]) {
                ++childCount;
                meshCount += (unsigned int)pModel->m_Objects[index]->m_Meshes.size();
            }
        }

        // Allocate space for the child nodes on the root node
        pScene->mRootNode->mChildren = new aiNode*[ childCount ];

        // Create nodes for the whole scene
        std::vector<aiMesh*> MeshArray;
        MeshArray.reserve(meshCount);
        for (size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            createNodes(pModel, pModel->m_Objects[index], pScene->mRootNode, pScene, MeshArray);
        }

        ai_assert(pScene->mRootNode->mNumChildren == childCount);

        // Create mesh pointer buffer for this scene
        if (pScene->mNumMeshes > 0) {
            pScene->mMeshes = new aiMesh*[MeshArray.size()];
            for (size_t index = 0; index < MeshArray.size(); ++index) {
                pScene->mMeshes[index] = MeshArray[index];
            }
        }

        // Create all materials
        createMaterials(pModel, pScene);
    }else {
		if (pModel->m_Vertices.empty()){
			return;
		}

		std::unique_ptr<aiMesh> mesh( new aiMesh );
        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        unsigned int n = (unsigned int)pModel->m_Vertices.size();
        mesh->mNumVertices = n;

        mesh->mVertices = new aiVector3D[n];
        memcpy(mesh->mVertices, pModel->m_Vertices.data(), n*sizeof(aiVector3D) );

        if ( !pModel->m_Normals.empty() ) {
            mesh->mNormals = new aiVector3D[n];
            if (pModel->m_Normals.size() < n) {
                throw DeadlyImportError("OBJ: vertex normal index out of range");
            }
            memcpy(mesh->mNormals, pModel->m_Normals.data(), n*sizeof(aiVector3D));
        }

        if ( !pModel->m_VertexColors.empty() ){
            mesh->mColors[0] = new aiColor4D[mesh->mNumVertices];
            for (unsigned int i = 0; i < n; ++i) {
                if (i < pModel->m_VertexColors.size() ) {
                    const aiVector3D& color = pModel->m_VertexColors[i];
                    mesh->mColors[0][i] = aiColor4D(color.x, color.y, color.z, 1.0);
                }else {
                    throw DeadlyImportError("OBJ: vertex color index out of range");
                }
            }
        }

        pScene->mRootNode->mNumMeshes = 1;
        pScene->mRootNode->mMeshes = new unsigned int[1];
        pScene->mRootNode->mMeshes[0] = 0;
        pScene->mMeshes = new aiMesh*[1];
        pScene->mNumMeshes = 1;
        pScene->mMeshes[0] = mesh.release();
    }
}